

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_on_headers_received
              (nghttp2_session *session,nghttp2_frame *frame,nghttp2_stream *stream)

{
  nghttp2_on_begin_headers_callback p_Var1;
  int iVar2;
  int iVar3;
  
  if ((frame->hd).stream_id == 0) {
    iVar3 = session_inflate_handle_invalid_connection
                      (session,frame,-0x1f9,"HEADERS: stream_id == 0");
    return iVar3;
  }
  if ((stream->shut_flags & 1) == 0) {
    if (((session->server == '\0' ^ (byte)(frame->hd).stream_id) & 1) == 0) {
      if (stream->state == NGHTTP2_STREAM_OPENED) {
        iVar3 = session_call_on_begin_headers(session,frame);
        return iVar3;
      }
    }
    else if (stream->state != NGHTTP2_STREAM_CLOSING) {
      p_Var1 = (session->callbacks).on_begin_headers_callback;
      if (p_Var1 != (nghttp2_on_begin_headers_callback)0x0) {
        iVar2 = (*p_Var1)(session,frame,session->user_data);
        iVar3 = -0x386;
        if (iVar2 == 0) {
          iVar3 = iVar2;
        }
        if (iVar2 == -0x209) {
          iVar3 = iVar2;
        }
        return iVar3;
      }
      return 0;
    }
    return -0x67;
  }
  iVar3 = session_inflate_handle_invalid_connection(session,frame,-0x1fe,"HEADERS: stream closed");
  return iVar3;
}

Assistant:

int nghttp2_session_on_headers_received(nghttp2_session *session,
                                        nghttp2_frame *frame,
                                        nghttp2_stream *stream) {
  int rv = 0;
  if (frame->hd.stream_id == 0) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO, "HEADERS: stream_id == 0");
  }
  if ((stream->shut_flags & NGHTTP2_SHUT_RD)) {
    /* half closed (remote): from the spec:

       If an endpoint receives additional frames for a stream that is
       in this state it MUST respond with a stream error (Section
       5.4.2) of type STREAM_CLOSED.

       we go further, and make it connection error.
    */
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_STREAM_CLOSED, "HEADERS: stream closed");
  }
  if (nghttp2_session_is_my_stream_id(session, frame->hd.stream_id)) {
    if (stream->state == NGHTTP2_STREAM_OPENED) {
      rv = session_call_on_begin_headers(session, frame);
      if (rv != 0) {
        return rv;
      }
      return 0;
    }

    return NGHTTP2_ERR_IGN_HEADER_BLOCK;
  }
  /* If this is remote peer initiated stream, it is OK unless it
     has sent END_STREAM frame already. But if stream is in
     NGHTTP2_STREAM_CLOSING, we discard the frame. This is a race
     condition. */
  if (stream->state != NGHTTP2_STREAM_CLOSING) {
    rv = session_call_on_begin_headers(session, frame);
    if (rv != 0) {
      return rv;
    }
    return 0;
  }
  return NGHTTP2_ERR_IGN_HEADER_BLOCK;
}